

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

size_t absl::strings_internal::CalculateBase64EscapedLenInternal(size_t input_len,bool do_padding)

{
  size_t sVar1;
  byte in_SIL;
  ulong in_RDI;
  size_t len;
  char *absl_raw_log_internal_filename;
  string death_message;
  size_t kMaxSize;
  int *in_stack_ffffffffffffff58;
  allocator<char> *args_1;
  allocator<char> *args;
  AtomicHook<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff70;
  size_t sVar2;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = 0xbffffffffffffffd;
  if (0xbffffffffffffffd < in_RDI) {
    args = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_39);
    args_1 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::string::operator+=(local_38,(string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator(&local_71);
    base_internal::
    AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
              (in_stack_ffffffffffffff70,(LogSeverity *)args,(char **)args_1,
               in_stack_ffffffffffffff58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x54c776);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/escaping.cc"
                  ,0x2b,
                  "size_t absl::strings_internal::CalculateBase64EscapedLenInternal(size_t, bool)");
  }
  sVar1 = (in_RDI / 3) * 4;
  sVar2 = sVar1;
  if (in_RDI % 3 != 0) {
    if (in_RDI % 3 == 1) {
      sVar2 = sVar1 + 2;
      if (local_9 != 0) {
        sVar2 = sVar1 + 4;
      }
    }
    else {
      sVar2 = sVar1 + 3;
      if (local_9 != 0) {
        sVar2 = sVar1 + 4;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t CalculateBase64EscapedLenInternal(size_t input_len, bool do_padding) {
  // Base64 encodes three bytes of input at a time. If the input is not
  // divisible by three, we pad as appropriate.
  //
  // Base64 encodes each three bytes of input into four bytes of output.
  constexpr size_t kMaxSize = (std::numeric_limits<size_t>::max() - 1) / 4 * 3;
  ABSL_INTERNAL_CHECK(input_len <= kMaxSize,
                      "CalculateBase64EscapedLenInternal() overflow");
  size_t len = (input_len / 3) * 4;

  // Since all base 64 input is an integral number of octets, only the following
  // cases can arise:
  if (input_len % 3 == 0) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (1) the final quantum of encoding input is an integral multiple of 24
    // bits; here, the final unit of encoded output will be an integral
    // multiple of 4 characters with no "=" padding,
  } else if (input_len % 3 == 1) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (2) the final quantum of encoding input is exactly 8 bits; here, the
    // final unit of encoded output will be two characters followed by two
    // "=" padding characters, or
    len += 2;
    if (do_padding) {
      len += 2;
    }
  } else {  // (input_len % 3 == 2)
    // (from https://tools.ietf.org/html/rfc3548)
    // (3) the final quantum of encoding input is exactly 16 bits; here, the
    // final unit of encoded output will be three characters followed by one
    // "=" padding character.
    len += 3;
    if (do_padding) {
      len += 1;
    }
  }

  return len;
}